

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

bool peparse::getRelocations(parsed_pe *p)

{
  bool bVar1;
  vector<peparse::reloc,_std::allocator<peparse::reloc>_> *this;
  long in_RDI;
  reloc r;
  VA relocVA;
  uint16_t offset;
  uint8_t type;
  uint16_t entry;
  uint32_t entryCount;
  uint32_t blockSize;
  uint32_t pageRva;
  uint32_t rvaofft;
  VA vaAddr;
  section d;
  data_directory relocDir;
  undefined4 in_stack_ffffffffffffff4c;
  undefined2 local_9e;
  undefined4 local_9c;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_78;
  undefined4 local_50;
  section *in_stack_ffffffffffffffc8;
  VA in_stack_ffffffffffffffd0;
  vector<peparse::section,_std::allocator<peparse::section>_> *in_stack_ffffffffffffffd8;
  uint32_t in_stack_ffffffffffffffe4;
  bounded_buffer *b;
  undefined1 local_1;
  
  if (*(short *)(in_RDI + 0x268) == 0x10b) {
    b = *(bounded_buffer **)(in_RDI + 0x120);
  }
  else {
    if (*(short *)(in_RDI + 0x268) != 0x20b) {
      local_1 = 0;
      goto LAB_001459f1;
    }
    b = *(bounded_buffer **)(in_RDI + 0x210);
  }
  if ((int)((ulong)b >> 0x20) != 0) {
    section::section((section *)0x145704);
    if (*(short *)(in_RDI + 0x268) == 0x10b) {
      local_78 = *(int *)(in_RDI + 0xb4);
LAB_00145782:
      local_78 = (int)b + local_78;
      bVar1 = getSecForVA(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                          in_stack_ffffffffffffffc8);
      if (bVar1) {
        local_90 = local_78 - local_50;
        while (local_90 < (uint)((ulong)b >> 0x20)) {
          bVar1 = readDword(b,in_stack_ffffffffffffffe4,(uint32_t *)in_stack_ffffffffffffffd8);
          if (!bVar1) {
            local_1 = 0;
            bVar1 = true;
            goto LAB_001459d1;
          }
          bVar1 = readDword(b,in_stack_ffffffffffffffe4,(uint32_t *)in_stack_ffffffffffffffd8);
          if (!bVar1) {
            local_1 = 0;
            bVar1 = true;
            goto LAB_001459d1;
          }
          local_90 = local_90 + 8;
          for (local_9c = local_98 - 8U >> 1; local_9c != 0; local_9c = local_9c - 1) {
            bVar1 = readWord(b,in_stack_ffffffffffffffe4,(uint16_t *)in_stack_ffffffffffffffd8);
            if (!bVar1) {
              local_1 = 0;
              bVar1 = true;
              goto LAB_001459d1;
            }
            if (*(short *)(in_RDI + 0x268) == 0x10b) {
              this = (vector<peparse::reloc,_std::allocator<peparse::reloc>_> *)
                     (ulong)(local_94 + (uint)(local_9e & 0xfff) + *(int *)(in_RDI + 0xb4));
            }
            else {
              if (*(short *)(in_RDI + 0x268) != 0x20b) {
                local_1 = 0;
                bVar1 = true;
                goto LAB_001459d1;
              }
              this = (vector<peparse::reloc,_std::allocator<peparse::reloc>_> *)
                     ((ulong)(local_94 + (uint)(local_9e & 0xfff)) + *(long *)(in_RDI + 400));
            }
            std::vector<peparse::reloc,_std::allocator<peparse::reloc>_>::push_back
                      (this,(value_type *)
                            CONCAT44(in_stack_ffffffffffffff4c,(int)(uint)local_9e >> 0xc));
            local_90 = local_90 + 2;
          }
        }
        bVar1 = false;
      }
      else {
        local_1 = 0;
        bVar1 = true;
      }
    }
    else {
      if (*(short *)(in_RDI + 0x268) == 0x20b) {
        local_78 = (int)*(undefined8 *)(in_RDI + 400);
        goto LAB_00145782;
      }
      local_1 = 0;
      bVar1 = true;
    }
LAB_001459d1:
    section::~section((section *)0x1459db);
    if (bVar1) goto LAB_001459f1;
  }
  local_1 = 1;
LAB_001459f1:
  return (bool)(local_1 & 1);
}

Assistant:

bool getRelocations(parsed_pe *p) {
  data_directory relocDir;
  if (p->peHeader.nt.OptionalMagic == NT_OPTIONAL_32_MAGIC) {
    relocDir = p->peHeader.nt.OptionalHeader.DataDirectory[DIR_BASERELOC];
  } else if (p->peHeader.nt.OptionalMagic == NT_OPTIONAL_64_MAGIC) {
    relocDir = p->peHeader.nt.OptionalHeader64.DataDirectory[DIR_BASERELOC];
  } else {
    return false;
  }

  if (relocDir.Size != 0) {
    section d;
    VA vaAddr;
    if (p->peHeader.nt.OptionalMagic == NT_OPTIONAL_32_MAGIC) {
      vaAddr =
          relocDir.VirtualAddress + p->peHeader.nt.OptionalHeader.ImageBase;
    } else if (p->peHeader.nt.OptionalMagic == NT_OPTIONAL_64_MAGIC) {
      vaAddr =
          relocDir.VirtualAddress + p->peHeader.nt.OptionalHeader64.ImageBase;
    } else {
      return false;
    }

    if (!getSecForVA(p->internal->secs, vaAddr, d)) {
      return false;
    }

    auto rvaofft = static_cast<std::uint32_t>(vaAddr - d.sectionBase);

    while (rvaofft < relocDir.Size) {
      std::uint32_t pageRva;
      std::uint32_t blockSize;

      if (!readDword(d.sectionData,
                     rvaofft + offsetof(reloc_block, PageRVA),
                     pageRva)) {
        return false;
      }

      if (!readDword(d.sectionData,
                     rvaofft + offsetof(reloc_block, BlockSize),
                     blockSize)) {
        return false;
      }

      // BlockSize - The total number of bytes in the base relocation block,
      // including the Page RVA and Block Size fields and the Type/Offset fields
      // that follow. Therefore we should subtract 8 bytes from BlockSize to
      // exclude the Page RVA and Block Size fields.
      std::uint32_t entryCount = (blockSize - 8) / sizeof(std::uint16_t);

      // Skip the Page RVA and Block Size fields
      rvaofft += sizeof(reloc_block);

      // Iterate over all of the block Type/Offset entries
      while (entryCount != 0) {
        std::uint16_t entry;
        std::uint8_t type;
        std::uint16_t offset;

        if (!readWord(d.sectionData, rvaofft, entry)) {
          return false;
        }

        // Mask out the type and assign
        type = entry >> 12;
        // Mask out the offset and assign
        offset = entry & static_cast<std::uint16_t>(~0xf000);

        // Produce the VA of the relocation
        VA relocVA;
        if (p->peHeader.nt.OptionalMagic == NT_OPTIONAL_32_MAGIC) {
          relocVA = pageRva + offset + p->peHeader.nt.OptionalHeader.ImageBase;
        } else if (p->peHeader.nt.OptionalMagic == NT_OPTIONAL_64_MAGIC) {
          relocVA =
              pageRva + offset + p->peHeader.nt.OptionalHeader64.ImageBase;
        } else {
          return false;
        }

        // Store in our list
        reloc r;

        r.shiftedAddr = relocVA;
        r.type = static_cast<reloc_type>(type);
        p->internal->relocs.push_back(r);

        entryCount--;
        rvaofft += sizeof(std::uint16_t);
      }
    }
  }

  return true;
}